

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

SPStatus GetSurrogatePair(TidyDocImpl *doc,Bool isXml,uint *pch)

{
  tchar low;
  bool bVar1;
  Bool BVar2;
  uint uVar3;
  uint local_58;
  int i;
  uint fch;
  int type;
  SPStatus status;
  tmbstr buf;
  uint offset;
  uint ch;
  uint c;
  uint bufSize;
  Lexer *lexer;
  uint *pch_local;
  TidyDocImpl *pTStack_18;
  Bool isXml_local;
  TidyDocImpl *doc_local;
  
  _c = doc->lexer;
  ch = 0x20;
  buf._0_4_ = 0;
  fch = 2;
  bVar1 = false;
  low = *pch;
  if (_c == (Lexer *)0x0) {
    doc_local._4_4_ = SP_error;
  }
  else {
    lexer = (Lexer *)pch;
    pch_local._4_4_ = isXml;
    pTStack_18 = doc;
    _type = (*_c->allocator->vtbl->realloc)(_c->allocator,(void *)0x0,0x20);
    if (_type == (void *)0x0) {
      doc_local._4_4_ = SP_error;
    }
    else {
      do {
        while( true ) {
          while( true ) {
            while( true ) {
              offset = prvTidyReadChar(pTStack_18->docIn);
              if ((offset == 0xffffffff) || (offset == 0x3b)) goto LAB_00158f5a;
              if (ch < (uint)buf + 2) {
                ch = ch << 1;
                _type = (*_c->allocator->vtbl->realloc)(_c->allocator,_type,(size_t)ch);
                if (_type == (void *)0x0) goto LAB_00158f5a;
              }
              uVar3 = (uint)buf + 1;
              *(char *)((long)_type + (ulong)(uint)buf) = (char)offset;
              buf._0_4_ = uVar3;
              if (uVar3 != 1) break;
              if (offset != 0x23) goto LAB_00158f5a;
            }
            if ((uVar3 != 2) || ((offset != 0x78 && ((pch_local._4_4_ != no || (offset != 0x58))))))
            break;
            bVar1 = true;
          }
          if (!bVar1) break;
          BVar2 = IsDigitHex(offset);
          if (BVar2 == no) goto LAB_00158f5a;
        }
        BVar2 = prvTidyIsDigit(offset);
      } while (BVar2 != no);
LAB_00158f5a:
      if (offset == 0x3b) {
        *(undefined1 *)((long)_type + (ulong)(uint)buf) = 0;
        if (bVar1) {
          __isoc99_sscanf((long)_type + 2,"%x",(long)&buf + 4);
        }
        else {
          __isoc99_sscanf((long)_type + 1,"%d",(long)&buf + 4);
        }
        BVar2 = prvTidyIsHighSurrogate(buf._4_4_);
        if (BVar2 != no) {
          buf._4_4_ = prvTidyCombineSurrogatePair(buf._4_4_,low);
          BVar2 = prvTidyIsValidCombinedChar(buf._4_4_);
          if (BVar2 == no) {
            lexer->lines = 0xfffd;
            prvTidyReportSurrogateError(pTStack_18,0x22f,low,buf._4_4_);
          }
          else {
            lexer->lines = buf._4_4_;
          }
          fch = (uint)(BVar2 == no);
        }
      }
      if (fch == 2) {
        if (offset == 0x3b) {
          prvTidyUngetChar(0x3b,pTStack_18->docIn);
        }
        if ((_type != (void *)0x0) && (local_58 = (uint)buf, (uint)buf != 0)) {
          while (local_58 = local_58 - 1, -1 < (int)local_58) {
            offset = (uint)*(char *)((long)_type + (long)(int)local_58);
            prvTidyUngetChar(offset,pTStack_18->docIn);
          }
        }
      }
      if (_type != (void *)0x0) {
        (*_c->allocator->vtbl->free)(_c->allocator,_type);
      }
      doc_local._4_4_ = fch;
    }
  }
  return doc_local._4_4_;
}

Assistant:

static SPStatus GetSurrogatePair(TidyDocImpl* doc, Bool isXml, uint *pch)
{
    Lexer* lexer = doc->lexer;
    uint bufSize = 32;
    uint c, ch, offset = 0;
    tmbstr buf = 0;
    SPStatus status = SP_error;  /* assume failed */
    int type = 0;   /* assume numeric */
    uint fch = *pch;
    int i;  /* has to be signed due to for i >= 0 */
    if (!lexer)
        return status;
    buf = (tmbstr)TidyRealloc(lexer->allocator, buf, bufSize);
    if (!buf)
        return status;
    while ((c = TY_(ReadChar)(doc->docIn)) != EndOfStream )
    {
        if (c == ';')
        {
            break;  /* reached end of entity */
        }
        if ((offset + 2) > bufSize)
        {
            bufSize *= 2;
            buf = (tmbstr)TidyRealloc(lexer->allocator, buf, bufSize);
            if (!buf)
            {
                break;
            }
        }
        buf[offset++] = c;  /* add char to buffer */
        if (offset == 1)
        {
            if (c != '#')   /* is a numeric entity */
                break;
        }
        else if (offset == 2 && ((c == 'x') || (!isXml && c == 'X')))
        {
            type = 1;   /* set hex digits */
        }
        else
        {
            if (type)   /* if hex digits */
            {
                if (!IsDigitHex(c))
                    break;
            }
            else    /* if numeric */
            {
                if (!TY_(IsDigit)(c))
                    break;
            }
        }
    }

    if (c == ';')
    {
        buf[offset] = 0;
        if (type)
            sscanf(buf + 2, "%x", &ch);
        else
            sscanf(buf + 1, "%d", &ch);

        if (TY_(IsHighSurrogate)(ch))
        {
            ch = TY_(CombineSurrogatePair)(ch, fch);
            if (TY_(IsValidCombinedChar)(ch))
            {
                *pch = ch;  /* return combined pair value */
                status = SP_ok; /* full success - pair used */
            }
            else
            {
                status = SP_failed; /* is one of the 32 out-of-range pairs */
                *pch = 0xFFFD;  /* return substitute character */
                TY_(ReportSurrogateError)(doc, BAD_SURROGATE_PAIR, fch, ch); /* SP WARNING: -  */
            }
        }
    }

    if (status == SP_error)
    {
        /* Error condition - can only put back all the chars */
        if (c == ';') /* if last, not added to buffer */
            TY_(UngetChar)(c, doc->docIn);
        if (buf && offset)
        {
            /* correct the order for unget - last first */
            for (i = offset - 1; i >= 0; i--)
            {
                c = buf[i];
                TY_(UngetChar)(c, doc->docIn);
            }
        }
    }

    if (buf)
        TidyFree(lexer->allocator, buf);

    return status;
}